

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerImpl::CommandReenroll
          (CommissionerImpl *this,ErrorHandler *aHandler,string *aDstAddr)

{
  undefined8 aDstAddr_00;
  bool bVar1;
  uint uVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  Error local_300;
  Error local_2d8;
  allocator local_2a9;
  string local_2a8;
  function<void_(ot::commissioner::Error)> local_288;
  anon_class_1_0_00000001 local_262;
  v10 local_261;
  v10 *local_260;
  size_t local_258;
  string local_250;
  Error local_230;
  anon_class_1_0_00000001 local_202;
  v10 local_201;
  v10 *local_200;
  size_t local_1f8;
  string local_1f0;
  Error local_1d0;
  undefined1 local_198 [8];
  Error error;
  string *aDstAddr_local;
  ErrorHandler *aHandler_local;
  CommissionerImpl *this_local;
  undefined1 local_140 [16];
  v10 *local_130;
  ulong local_128;
  v10 *local_120;
  size_t sStack_118;
  string *local_110;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_108 [2];
  undefined1 local_f8 [16];
  v10 *local_e8;
  ulong local_e0;
  v10 *local_d8;
  size_t sStack_d0;
  string *local_c8;
  v10 *local_c0;
  v10 **local_b8;
  v10 *local_b0;
  v10 **local_a8;
  v10 **local_a0;
  v10 *local_98;
  size_t sStack_90;
  v10 **local_80;
  v10 *local_78;
  size_t sStack_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_68;
  undefined1 *local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_58;
  undefined8 local_50;
  undefined1 *local_48;
  CommissionerImpl **local_40;
  undefined1 *local_38;
  CommissionerImpl **local_30;
  undefined8 local_28;
  undefined1 *local_20;
  CommissionerImpl **local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_10;
  
  error.mMessage.field_2._8_8_ = aDstAddr;
  Error::Error((Error *)local_198);
  uVar2 = (*(this->super_Commissioner)._vptr_Commissioner[9])();
  if ((uVar2 & 1) == 0) {
    CommandReenroll::anon_class_1_0_00000001::operator()(&local_202);
    local_b8 = &local_200;
    local_c0 = &local_201;
    bVar3 = ::fmt::v10::operator()(local_c0);
    local_1f8 = bVar3.size_;
    local_200 = (v10 *)bVar3.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_c8 = &local_1f0;
    local_d8 = local_200;
    sStack_d0 = local_1f8;
    local_a0 = &local_d8;
    local_e8 = local_200;
    local_e0 = local_1f8;
    local_98 = local_e8;
    sStack_90 = local_e0;
    local_108[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_60 = local_f8;
    local_68 = local_108;
    local_50 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_e0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_68;
    local_58 = local_68;
    local_48 = local_60;
    local_10 = local_68;
    ::fmt::v10::vformat_abi_cxx11_(&local_1f0,local_e8,fmt,args);
    Error::Error(&local_1d0,kInvalidState,&local_1f0);
    Error::operator=((Error *)local_198,&local_1d0);
    Error::~Error(&local_1d0);
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  else {
    uVar2 = (*(this->super_Commissioner)._vptr_Commissioner[10])();
    if ((uVar2 & 1) == 0) {
      CommandReenroll::anon_class_1_0_00000001::operator()(&local_262);
      local_a8 = &local_260;
      local_b0 = &local_261;
      bVar3 = ::fmt::v10::operator()(local_b0);
      local_258 = bVar3.size_;
      local_260 = (v10 *)bVar3.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_110 = &local_250;
      local_120 = local_260;
      sStack_118 = local_258;
      local_80 = &local_120;
      local_130 = local_260;
      local_128 = local_258;
      local_78 = local_130;
      sStack_70 = local_128;
      this_local = (CommissionerImpl *)
                   ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_38 = local_140;
      local_40 = &this_local;
      local_28 = 0;
      fmt_00.size_ = 0;
      fmt_00.data_ = (char *)local_128;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_40;
      local_30 = local_40;
      local_20 = local_38;
      local_18 = local_40;
      ::fmt::v10::vformat_abi_cxx11_(&local_250,local_130,fmt_00,args_00);
      Error::Error(&local_230,kInvalidState,&local_250);
      Error::operator=((Error *)local_198,&local_230);
      Error::~Error(&local_230);
      std::__cxx11::string::~string((string *)&local_250);
    }
    else {
      std::function<void_(ot::commissioner::Error)>::function(&local_288,aHandler);
      aDstAddr_00 = error.mMessage.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2a8,"/c/re",&local_2a9);
      SendProxyMessage(this,&local_288,(string *)aDstAddr_00,&local_2a8);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
      std::function<void_(ot::commissioner::Error)>::~function(&local_288);
    }
  }
  Error::Error(&local_2d8);
  bVar1 = Error::operator!=((Error *)local_198,&local_2d8);
  Error::~Error(&local_2d8);
  if (bVar1) {
    Error::Error(&local_300,(Error *)local_198);
    std::function<void_(ot::commissioner::Error)>::operator()(aHandler,&local_300);
    Error::~Error(&local_300);
  }
  Error::~Error((Error *)local_198);
  return;
}

Assistant:

void CommissionerImpl::CommandReenroll(ErrorHandler aHandler, const std::string &aDstAddr)
{
    Error error;

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));
    VerifyOrExit(IsCcmMode(), error = ERROR_INVALID_STATE("en-enroll a device is not in CCM Mode"));
    SendProxyMessage(aHandler, aDstAddr, uri::kMgmtReenroll);

exit:
    if (error != ERROR_NONE)
    {
        aHandler(error);
    }
}